

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiID *pIVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiID IVar5;
  ImGuiTabBarSortItem *pIVar6;
  ImGuiWindow *pIVar7;
  ImVec2 IVar8;
  bool bVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ImGuiID IVar17;
  ImGuiID IVar18;
  ImGuiID IVar19;
  ImGuiTabItemFlags IVar20;
  ImGuiContext *pIVar21;
  float fVar22;
  float fVar23;
  ImGuiContext *pIVar24;
  bool bVar25;
  float fVar26;
  ImGuiTabItem *pIVar27;
  ImGuiTabBarSortItem *__dest;
  long lVar28;
  float *pfVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  ImGuiTabItem *pIVar35;
  bool bVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  ImGuiTabItem *pIVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  ImGuiTabItem item_tmp;
  ImVec4 local_88;
  undefined4 uStack_78;
  undefined8 uStack_74;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImVec4 local_48;
  
  pIVar24 = GImGui;
  tab_bar->WantLayout = false;
  uVar33 = (tab_bar->Tabs).Size;
  if ((int)uVar33 < 1) {
    uVar32 = 0;
  }
  else {
    lVar28 = 0;
    uVar31 = 0;
    uVar32 = 0;
    do {
      pIVar40 = (tab_bar->Tabs).Data;
      pIVar1 = (ImGuiID *)((long)&pIVar40->ID + lVar28);
      if (*(int *)((long)&pIVar40->LastFrameVisible + lVar28) < tab_bar->PrevFrameVisible) {
        if (*pIVar1 == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        iVar39 = (int)uVar32;
        if (uVar31 != uVar32) {
          IVar5 = pIVar1[0];
          IVar17 = pIVar1[1];
          IVar18 = pIVar1[2];
          IVar19 = pIVar1[3];
          fVar42 = (float)pIVar1[4];
          fVar41 = (float)pIVar1[5];
          fVar47 = (float)pIVar1[6];
          piVar2 = &pIVar40[iVar39].LastFrameSelected;
          *piVar2 = pIVar1[3];
          piVar2[1] = (int)fVar42;
          piVar2[2] = (int)fVar41;
          piVar2[3] = (int)fVar47;
          pIVar40 = pIVar40 + iVar39;
          pIVar40->ID = IVar5;
          pIVar40->Flags = IVar17;
          pIVar40->LastFrameVisible = IVar18;
          pIVar40->LastFrameSelected = IVar19;
          uVar33 = (tab_bar->Tabs).Size;
        }
        uVar32 = (ulong)(iVar39 + 1);
      }
      uVar31 = uVar31 + 1;
      lVar28 = lVar28 + 0x1c;
    } while ((long)uVar31 < (long)(int)uVar33);
  }
  uVar30 = (uint)uVar32;
  if (uVar33 != uVar30) {
    iVar39 = (tab_bar->Tabs).Capacity;
    if (iVar39 < (int)uVar30) {
      if (iVar39 == 0) {
        uVar33 = 8;
      }
      else {
        uVar33 = iVar39 / 2 + iVar39;
      }
      if ((int)uVar33 <= (int)uVar30) {
        uVar33 = uVar30;
      }
      pIVar27 = (ImGuiTabItem *)MemAlloc((long)(int)uVar33 * 0x1c);
      pIVar40 = (tab_bar->Tabs).Data;
      if (pIVar40 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar27,pIVar40,(long)(tab_bar->Tabs).Size * 0x1c);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar27;
      (tab_bar->Tabs).Capacity = uVar33;
    }
    (tab_bar->Tabs).Size = uVar30;
  }
  fVar42 = (float)tab_bar->NextSelectedTabId;
  if (fVar42 != 0.0) {
    tab_bar->SelectedTabId = (ImGuiID)fVar42;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    if (0 < (int)uVar30) {
      pIVar40 = (tab_bar->Tabs).Data;
      lVar28 = 0;
      pIVar27 = pIVar40;
      do {
        if (pIVar27->ID == tab_bar->ReorderRequestTabId) {
          uVar32 = (ulong)(uint)tab_bar->ReorderRequestDir - lVar28;
          if ((uint)uVar32 < uVar30) {
            uVar32 = uVar32 & 0xffffffff;
            local_88.x = (float)pIVar27->ID;
            local_88.y = (float)pIVar27->Flags;
            uVar11 = pIVar27->LastFrameVisible;
            uVar12 = pIVar27->LastFrameSelected;
            uVar13 = pIVar27->Offset;
            uStack_74._0_4_ = pIVar27->Width;
            uStack_74._4_4_ = pIVar27->WidthContents;
            pIVar35 = pIVar40 + uVar32;
            IVar5 = pIVar35->ID;
            IVar20 = pIVar35->Flags;
            iVar39 = pIVar35->LastFrameVisible;
            iVar37 = pIVar35->LastFrameSelected;
            pIVar35 = pIVar40 + uVar32;
            fVar41 = pIVar35->Offset;
            uVar14 = *(undefined8 *)(&pIVar35->LastFrameSelected + 2);
            pIVar27->LastFrameSelected = pIVar35->LastFrameSelected;
            pIVar27->Offset = fVar41;
            *(undefined8 *)&pIVar27->Width = uVar14;
            pIVar27->ID = IVar5;
            pIVar27->Flags = IVar20;
            pIVar27->LastFrameVisible = iVar39;
            pIVar27->LastFrameSelected = iVar37;
            pIVar27 = pIVar40 + uVar32;
            pIVar27->ID = (ImGuiID)local_88.x;
            pIVar27->Flags = (ImGuiTabItemFlags)local_88.y;
            pIVar27->LastFrameVisible = uVar11;
            pIVar27->LastFrameSelected = uVar12;
            pIVar27 = pIVar40 + uVar32;
            pIVar27->LastFrameSelected = uVar12;
            pIVar27->Offset = (float)uVar13;
            *(undefined8 *)(&pIVar27->LastFrameSelected + 2) = uStack_74;
            local_88.z = (float)uVar11;
            local_88.w = (float)uVar12;
            uStack_78 = uVar13;
            if (pIVar40[uVar32].ID == tab_bar->SelectedTabId) {
              fVar42 = (float)pIVar40[uVar32].ID;
            }
          }
          if ((tab_bar->Flags & 0x800000) != 0) {
            MarkIniSettingsDirty();
          }
          break;
        }
        lVar28 = lVar28 + -1;
        pIVar27 = pIVar27 + 1;
      } while (-lVar28 != uVar32);
    }
    tab_bar->ReorderRequestTabId = 0;
    uVar32 = (ulong)(uint)(tab_bar->Tabs).Size;
  }
  iVar39 = (pIVar24->TabSortByWidthBuffer).Capacity;
  iVar37 = (int)uVar32;
  if (iVar39 < iVar37) {
    if (iVar39 == 0) {
      iVar39 = 8;
    }
    else {
      iVar39 = iVar39 / 2 + iVar39;
    }
    if (iVar39 <= iVar37) {
      iVar39 = iVar37;
    }
    __dest = (ImGuiTabBarSortItem *)MemAlloc((long)iVar39 << 3);
    pIVar6 = (pIVar24->TabSortByWidthBuffer).Data;
    if (pIVar6 != (ImGuiTabBarSortItem *)0x0) {
      memcpy(__dest,pIVar6,(long)(pIVar24->TabSortByWidthBuffer).Size << 3);
      MemFree((pIVar24->TabSortByWidthBuffer).Data);
    }
    (pIVar24->TabSortByWidthBuffer).Data = __dest;
    (pIVar24->TabSortByWidthBuffer).Capacity = iVar39;
    uVar32 = (ulong)(uint)(tab_bar->Tabs).Size;
  }
  (pIVar24->TabSortByWidthBuffer).Size = iVar37;
  uVar33 = (uint)uVar32;
  if ((int)uVar33 < 1) {
    bVar36 = true;
    pIVar40 = (ImGuiTabItem *)0x0;
    fVar41 = 0.0;
  }
  else {
    pIVar27 = (tab_bar->Tabs).Data;
    IVar5 = tab_bar->SelectedTabId;
    pIVar6 = (pIVar24->TabSortByWidthBuffer).Data;
    fVar41 = 0.0;
    uVar31 = 0;
    pIVar40 = (ImGuiTabItem *)0x0;
    bVar36 = false;
    do {
      if ((pIVar40 == (ImGuiTabItem *)0x0) ||
         (pIVar40->LastFrameSelected < pIVar27->LastFrameSelected)) {
        pIVar40 = pIVar27;
      }
      if (pIVar27->ID == IVar5) {
        bVar36 = true;
      }
      if (uVar31 == 0) {
        fVar47 = 0.0;
      }
      else {
        fVar47 = (pIVar24->Style).ItemInnerSpacing.x;
      }
      fVar45 = pIVar27->WidthContents;
      fVar41 = fVar41 + fVar47 + fVar45;
      pIVar6[uVar31].Index = (int)uVar31;
      pIVar6[uVar31].Width = fVar45;
      uVar31 = uVar31 + 1;
      pIVar27 = pIVar27 + 1;
    } while (uVar32 != uVar31);
    bVar36 = !bVar36;
  }
  fVar47 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar41 = (float)(-(uint)(fVar47 < fVar41) & (uint)(fVar41 - fVar47));
  if ((fVar41 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if ((int)uVar33 < 1) goto LAB_0015304f;
    fVar41 = GImGui->FontSize * 20.0;
    pIVar27 = (tab_bar->Tabs).Data;
    lVar28 = 0;
    do {
      fVar47 = *(float *)((long)&pIVar27->WidthContents + lVar28);
      if (fVar41 <= fVar47) {
        fVar47 = fVar41;
      }
      *(float *)((long)&pIVar27->Width + lVar28) = fVar47;
      lVar28 = lVar28 + 0x1c;
    } while (uVar32 * 0x1c != lVar28);
LAB_00152ffe:
    uVar33 = (uint)uVar32;
    pIVar27 = (tab_bar->Tabs).Data;
    fVar41 = (pIVar24->Style).ItemInnerSpacing.x;
    fVar47 = 0.0;
    lVar28 = 0;
    do {
      *(float *)((long)&pIVar27->Offset + lVar28) = fVar47;
      if ((fVar42 == 0.0) &&
         (fVar42 = *(float *)((long)&pIVar27->ID + lVar28),
         (float)pIVar24->NavJustMovedToId != fVar42)) {
        fVar42 = 0.0;
      }
      fVar47 = fVar47 + *(float *)((long)&pIVar27->Width + lVar28) + fVar41;
      lVar28 = lVar28 + 0x1c;
    } while (uVar32 * 0x1c != lVar28);
  }
  else {
    if (1 < (int)uVar33) {
      qsort((pIVar24->TabSortByWidthBuffer).Data,(long)iVar37,8,TabBarSortItemComparer);
    }
    uVar33 = (tab_bar->Tabs).Size;
    uVar32 = (ulong)uVar33;
    uVar31 = 1;
    do {
      iVar39 = (int)uVar31;
      if ((int)uVar33 <= iVar39) break;
      pIVar6 = (pIVar24->TabSortByWidthBuffer).Data;
      fVar47 = pIVar6->Width;
      pfVar29 = &pIVar6[iVar39].Width;
      lVar28 = (long)iVar39 << 0x20;
      do {
        if ((fVar47 != *pfVar29) || (NAN(fVar47) || NAN(*pfVar29))) {
          fVar47 = fVar47 - *(float *)((long)&pIVar6->Width + (lVar28 >> 0x1d));
          goto LAB_00152f7a;
        }
        lVar28 = lVar28 + 0x100000000;
        uVar30 = (int)uVar31 + 1;
        uVar31 = (ulong)uVar30;
        pfVar29 = pfVar29 + 2;
      } while (uVar33 != uVar30);
      fVar47 = fVar47 + -1.0;
      uVar31 = uVar32;
LAB_00152f7a:
      fVar46 = (float)(int)uVar31;
      fVar45 = fVar41 / fVar46;
      if (fVar47 <= fVar45) {
        fVar45 = fVar47;
      }
      if (0 < (int)uVar31) {
        uVar34 = 0;
        do {
          pIVar6[uVar34].Width = pIVar6[uVar34].Width - fVar45;
          uVar34 = uVar34 + 1;
        } while (uVar31 != uVar34);
      }
      fVar41 = fVar41 - fVar45 * fVar46;
    } while (0.0 < fVar41);
    if (0 < (int)uVar33) {
      pIVar6 = (pIVar24->TabSortByWidthBuffer).Data;
      pIVar27 = (tab_bar->Tabs).Data;
      uVar31 = 0;
      do {
        pIVar27[pIVar6[uVar31].Index].Width = (float)(int)pIVar6[uVar31].Width;
        uVar31 = uVar31 + 1;
      } while (uVar32 != uVar31);
      goto LAB_00152ffe;
    }
LAB_0015304f:
    fVar41 = (pIVar24->Style).ItemInnerSpacing.x;
    fVar47 = 0.0;
  }
  fVar47 = (float)(-(uint)(0.0 <= fVar47 - fVar41) & (uint)(fVar47 - fVar41));
  tab_bar->OffsetMax = fVar47;
  tab_bar->OffsetNextTab = 0.0;
  pIVar21 = GImGui;
  fVar41 = (tab_bar->BarRect).Max.x;
  if (((1 < (int)uVar33) && (fVar45 = (tab_bar->BarRect).Min.x, fVar41 - fVar45 < fVar47)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar7 = GImGui->CurrentWindow;
    fVar48 = GImGui->FontSize + -2.0;
    fVar47 = (GImGui->Style).FramePadding.y;
    local_68.y = fVar47 + fVar47 + GImGui->FontSize;
    local_68.x = fVar48;
    uStack_60 = 0;
    local_58 = ZEXT416((uint)fVar48);
    fVar48 = fVar48 + fVar48;
    IVar8 = (pIVar7->DC).CursorPos;
    fVar47 = (tab_bar->BarRect).Max.y;
    fVar46 = IVar8.x;
    fVar26 = IVar8.y;
    bVar10 = fVar26 < (tab_bar->BarRect).Min.y;
    bVar9 = fVar41 < fVar48 + fVar46;
    if ((fVar47 < fVar26 || (bVar10 || fVar46 < fVar45)) || bVar9) {
      local_88.y = fVar47 + 0.0;
      local_88.x = (GImGui->Style).ItemInnerSpacing.x + fVar41;
      PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_88,true);
    }
    local_88.x = (pIVar21->Style).Colors[0].x;
    local_88.y = (pIVar21->Style).Colors[0].y;
    uVar15 = (pIVar21->Style).Colors[0].z;
    uVar16 = (pIVar21->Style).Colors[0].w;
    local_88.w = (float)uVar16 * 0.5;
    local_88.z = (float)uVar15;
    PushStyleColor(0,&local_88);
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_48.z = 0.0;
    local_48.w = 0.0;
    PushStyleColor(0x15,&local_48);
    fVar22 = (pIVar21->IO).KeyRepeatDelay;
    fVar23 = (pIVar21->IO).KeyRepeatRate;
    (pIVar21->IO).KeyRepeatDelay = 0.25;
    (pIVar21->IO).KeyRepeatRate = 0.2;
    fVar41 = (tab_bar->BarRect).Min.y;
    (pIVar7->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar48;
    (pIVar7->DC).CursorPos.y = fVar41;
    bVar25 = ArrowButtonEx("##<",0,local_68,5);
    iVar39 = -(uint)bVar25;
    fVar41 = (tab_bar->BarRect).Min.y;
    (pIVar7->DC).CursorPos.x = (float)local_58._0_4_ + ((tab_bar->BarRect).Max.x - fVar48);
    (pIVar7->DC).CursorPos.y = fVar41;
    bVar25 = ArrowButtonEx("##>",1,local_68,5);
    if (bVar25) {
      iVar39 = 1;
    }
    PopStyleColor(2);
    (pIVar21->IO).KeyRepeatDelay = fVar22;
    (pIVar21->IO).KeyRepeatRate = fVar23;
    if ((fVar47 < fVar26 || (bVar10 || fVar46 < fVar45)) || bVar9) {
      PopClipRect();
    }
    if ((iVar39 != 0) && (tab_bar->SelectedTabId != 0)) {
      uVar33 = (tab_bar->Tabs).Size;
      if (0 < (long)(int)uVar33) {
        pIVar27 = (tab_bar->Tabs).Data;
        lVar28 = 0;
        pIVar35 = pIVar27;
        do {
          if (pIVar35->ID == tab_bar->SelectedTabId) {
            (pIVar7->DC).CursorPos = IVar8;
            fVar41 = (tab_bar->BarRect).Max.x - (fVar48 + 1.0);
            (tab_bar->BarRect).Max.x = fVar41;
            uVar38 = iVar39 - (int)lVar28;
            uVar30 = -(int)lVar28;
            if (uVar38 < uVar33) {
              uVar30 = uVar38;
            }
            fVar42 = (float)pIVar27[(int)uVar30].ID;
            tab_bar->SelectedTabId = (ImGuiID)fVar42;
            goto LAB_0015330b;
          }
          lVar28 = lVar28 + -1;
          pIVar35 = pIVar35 + 1;
        } while (-lVar28 != (long)(int)uVar33);
      }
    }
    (pIVar7->DC).CursorPos = IVar8;
    fVar41 = (tab_bar->BarRect).Max.x - (fVar48 + 1.0);
    (tab_bar->BarRect).Max.x = fVar41;
  }
LAB_0015330b:
  if (bVar36) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    fVar47 = (float)tab_bar->SelectedTabId;
    if (fVar47 != 0.0) goto LAB_00153336;
  }
  fVar47 = 0.0;
  if ((tab_bar->NextSelectedTabId == 0) && (fVar47 = 0.0, pIVar40 != (ImGuiTabItem *)0x0)) {
    fVar42 = (float)pIVar40->ID;
    tab_bar->SelectedTabId = (ImGuiID)fVar42;
    fVar47 = fVar42;
  }
LAB_00153336:
  tab_bar->VisibleTabId = (ImGuiID)fVar47;
  tab_bar->VisibleTabWasSubmitted = false;
  if (fVar42 != 0.0) {
    iVar39 = (tab_bar->Tabs).Size;
    if (0 < (long)iVar39) {
      pfVar29 = &((tab_bar->Tabs).Data)->Width;
      lVar28 = 0;
      do {
        if ((float)((ImGuiTabItem *)(pfVar29 + -5))->ID == fVar42) {
          fVar42 = GImGui->FontSize;
          fVar47 = fVar42;
          if ((int)lVar28 < 1) {
            fVar47 = -0.0;
          }
          fVar47 = pfVar29[-1] - fVar47;
          if (iVar39 <= (int)lVar28 + 1) {
            fVar42 = 1.0;
          }
          fVar42 = pfVar29[-1] + *pfVar29 + fVar42;
          fVar45 = tab_bar->ScrollingTarget;
          if (fVar47 < tab_bar->ScrollingTarget) {
            tab_bar->ScrollingTarget = fVar47;
            fVar45 = fVar47;
          }
          fVar47 = fVar41 - (tab_bar->BarRect).Min.x;
          if (fVar45 + fVar47 < fVar42) {
            tab_bar->ScrollingTarget = fVar42 - fVar47;
          }
          break;
        }
        lVar28 = lVar28 + 1;
        pfVar29 = pfVar29 + 7;
      } while (iVar39 != lVar28);
    }
  }
  fVar42 = tab_bar->OffsetMax - (fVar41 - (tab_bar->BarRect).Min.x);
  uVar3 = tab_bar->ScrollingAnim;
  uVar4 = tab_bar->ScrollingTarget;
  auVar43._4_4_ = uVar4;
  auVar43._0_4_ = uVar3;
  auVar43._8_8_ = 0;
  auVar44._4_4_ = fVar42;
  auVar44._0_4_ = fVar42;
  auVar44._8_4_ = fVar42;
  auVar44._12_4_ = fVar42;
  auVar44 = minps(auVar43,auVar44);
  fVar42 = (float)(-(uint)(0.0 <= auVar44._0_4_) & (uint)auVar44._0_4_);
  fVar41 = (float)(-(uint)(0.0 <= auVar44._4_4_) & (uint)auVar44._4_4_);
  tab_bar->ScrollingAnim = fVar42;
  tab_bar->ScrollingTarget = fVar41;
  if (tab_bar->PrevFrameVisible + 1 < pIVar24->FrameCount) {
    fVar47 = 3.4028235e+38;
  }
  else {
    fVar47 = (pIVar24->IO).DeltaTime * pIVar24->FontSize * 70.0;
  }
  if ((fVar42 != fVar41) || (NAN(fVar42) || NAN(fVar41))) {
    if (fVar41 <= fVar42) {
      fVar45 = fVar42;
      if (fVar41 < fVar42) {
        uVar33 = -(uint)(fVar41 <= fVar42 - fVar47);
        fVar45 = (float)((uint)(fVar42 - fVar47) & uVar33 | ~uVar33 & (uint)fVar41);
      }
    }
    else {
      fVar45 = fVar42 + fVar47;
      if (fVar41 <= fVar42 + fVar47) {
        fVar45 = fVar41;
      }
    }
    tab_bar->ScrollingAnim = fVar45;
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    ImVector<ImGuiTabBarSortItem>& width_sort_buffer = g.TabSortByWidthBuffer;
    width_sort_buffer.resize(tab_bar->Tabs.Size);

    // Compute ideal widths
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately if we can (for manual tab bar, WidthContent will lag by one frame which is mostly noticeable when changing style.FramePadding.x)
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet, 
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        width_sort_buffer[tab_n].Index = tab_n;
        width_sort_buffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float width_avail = tab_bar->BarRect.GetWidth();
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        if (tab_bar->Tabs.Size > 1)
            ImQsort(width_sort_buffer.Data, (size_t)width_sort_buffer.Size, sizeof(ImGuiTabBarSortItem), TabBarSortItemComparer);
        int tab_count_same_width = 1;
        while (width_excess > 0.0f && tab_count_same_width < tab_bar->Tabs.Size)
        {
            while (tab_count_same_width < tab_bar->Tabs.Size && width_sort_buffer[0].Width == width_sort_buffer[tab_count_same_width].Width)
                tab_count_same_width++;
            float width_to_remove_per_tab_max = (tab_count_same_width < tab_bar->Tabs.Size) ? (width_sort_buffer[0].Width - width_sort_buffer[tab_count_same_width].Width) : (width_sort_buffer[0].Width - 1.0f);
            float width_to_remove_per_tab = ImMin(width_excess / tab_count_same_width, width_to_remove_per_tab_max);
            for (int tab_n = 0; tab_n < tab_count_same_width; tab_n++)
                width_sort_buffer[tab_n].Width -= width_to_remove_per_tab;
            width_excess -= width_to_remove_per_tab * tab_count_same_width;
        }
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[width_sort_buffer[tab_n].Index].Width = (float)(int)width_sort_buffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = 0.0f;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetNextTab = 0.0f;

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    const float scrolling_speed = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) ? FLT_MAX : (g.IO.DeltaTime * g.FontSize * 70.0f);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
        tab_bar->ScrollingAnim = ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, scrolling_speed);
}